

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this,const_iterator it)

{
  bool bVar1;
  reference ppIVar2;
  allocator local_29;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_28;
  ExceptionTranslatorRegistry *local_20;
  ExceptionTranslatorRegistry *this_local;
  const_iterator it_local;
  
  local_20 = this;
  this_local = (ExceptionTranslatorRegistry *)it._M_current;
  it_local._M_current = (IExceptionTranslator **)__return_storage_ptr__;
  local_28._M_current =
       (IExceptionTranslator **)
       std::
       vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
       ::end(&this->m_translators);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
                      *)&this_local,&local_28);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Unknown exception",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
              ::operator*((__normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
                           *)&this_local);
    (*(*ppIVar2)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tryTranslators( std::vector<const IExceptionTranslator*>::const_iterator it ) const {
            if( it == m_translators.end() )
                return "Unknown exception";

            try {
                return (*it)->translate();
            }
            catch(...) {
                return tryTranslators( it+1 );
            }
        }